

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazyARA.cpp
# Opt level: O1

bool __thiscall LazyARAPlanner::outOfTime(LazyARAPlanner *this)

{
  bool bVar1;
  clock_t cVar2;
  double dVar3;
  
  if ((this->params).return_first_solution != false) {
    return false;
  }
  cVar2 = clock();
  dVar3 = (double)(cVar2 - this->TimeStarted) / 1000000.0;
  bVar1 = true;
  if (dVar3 < (this->params).max_time) {
    bVar1 = false;
    if ((this->use_repair_time == true) &&
       ((this->eps_satisfied != 1000000000.0 || (bVar1 = false, NAN(this->eps_satisfied))))) {
      bVar1 = (this->params).repair_time <= dVar3;
    }
  }
  return bVar1;
}

Assistant:

bool LazyARAPlanner::outOfTime()
{
    // if we are supposed to run until the first solution, then we are never out
    // of time
    if (params.return_first_solution) {
        return false;
    }
    double time_used = double(clock() - TimeStarted) / CLOCKS_PER_SEC;
    if (time_used >= params.max_time) {
        SBPL_DEBUG("out of max time");
    }
    if (use_repair_time && eps_satisfied != INFINITECOST && time_used >= params.repair_time) {
        SBPL_DEBUG("used all repair time...");
    }
    // we are out of time if:
    // we used up the max time limit OR
    // we found some solution and used up the minimum time limit
    return time_used >= params.max_time ||
            (use_repair_time && eps_satisfied != INFINITECOST && time_used >= params.repair_time);
}